

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

char * __thiscall
cbtQuantizedBvh::serialize(cbtQuantizedBvh *this,void *dataBuffer,cbtSerializer *serializer)

{
  int iVar1;
  uint uVar2;
  cbtOptimizedBvhNode *pcVar3;
  cbtQuantizedBvhNode *pcVar4;
  cbtBvhSubtreeInfo *pcVar5;
  long lVar6;
  undefined2 *puVar7;
  long lVar8;
  long lVar9;
  cbtVector3FloatData *dataOut;
  
  cbtVector3::serialize(&this->m_bvhAabbMax,(cbtVector3FloatData *)((long)dataBuffer + 0x10));
  cbtVector3::serialize(&this->m_bvhAabbMin,(cbtVector3FloatData *)dataBuffer);
  cbtVector3::serialize(&this->m_bvhQuantization,(cbtVector3FloatData *)((long)dataBuffer + 0x20));
  *(int *)((long)dataBuffer + 0x30) = this->m_curNodeIndex;
  *(uint *)((long)dataBuffer + 0x34) = (uint)this->m_useQuantization;
  iVar1 = (this->m_contiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x38) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x40) = 0;
  }
  else {
    lVar6 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_contiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x40) = lVar6;
    if (lVar6 != 0) {
      uVar2 = (this->m_contiguousNodes).m_size;
      lVar6 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x30,uVar2);
      dataOut = *(cbtVector3FloatData **)(lVar6 + 8);
      for (lVar9 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) << 6 != lVar9; lVar9 = lVar9 + 0x40) {
        cbtVector3::serialize
                  ((cbtVector3 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar9),
                   dataOut + 1);
        cbtVector3::serialize
                  ((cbtVector3 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar9),
                   dataOut);
        pcVar3 = (this->m_contiguousNodes).m_data;
        *(undefined8 *)dataOut[2].m_floats = *(undefined8 *)(pcVar3->m_padding + lVar9 + -0xc);
        dataOut[2].m_floats[2] = *(float *)(pcVar3->m_padding + lVar9 + -4);
        dataOut[2].m_floats[3] = 0.0;
        dataOut = dataOut + 3;
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar6,"cbtOptimizedBvhNodeData",0x59415241);
    }
  }
  iVar1 = (this->m_quantizedContiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x3c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x48) = 0;
  }
  else {
    lVar6 = (**(code **)(*(long *)serializer + 0x38))
                      (serializer,(this->m_quantizedContiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x48) = lVar6;
    if (lVar6 != 0) {
      uVar2 = (this->m_quantizedContiguousNodes).m_size;
      lVar9 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,uVar2);
      lVar6 = *(long *)(lVar9 + 8);
      pcVar4 = (this->m_quantizedContiguousNodes).m_data;
      for (lVar8 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) << 4 != lVar8; lVar8 = lVar8 + 0x10) {
        *(undefined4 *)(lVar6 + 0xc + lVar8) =
             *(undefined4 *)((long)pcVar4->m_quantizedAabbMax + lVar8 + 6);
        *(undefined2 *)(lVar6 + 6 + lVar8) =
             *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar8);
        *(undefined2 *)(lVar6 + 8 + lVar8) =
             *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar8 + 2);
        *(undefined2 *)(lVar6 + 10 + lVar8) =
             *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar8 + 4);
        *(undefined2 *)(lVar6 + lVar8) = *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar8);
        *(undefined2 *)(lVar6 + 2 + lVar8) =
             *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar8 + 2);
        *(undefined2 *)(lVar6 + 4 + lVar8) =
             *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar8 + 4);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar9,"cbtQuantizedBvhNodeData",0x59415241);
    }
  }
  *(cbtTraversalMode *)((long)dataBuffer + 0x58) = this->m_traversalMode;
  iVar1 = (this->m_SubtreeHeaders).m_size;
  *(int *)((long)dataBuffer + 0x5c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x50) = 0;
  }
  else {
    lVar6 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_SubtreeHeaders).m_data);
    *(long *)((long)dataBuffer + 0x50) = lVar6;
    if (lVar6 != 0) {
      uVar2 = (this->m_SubtreeHeaders).m_size;
      lVar6 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x14,uVar2);
      pcVar5 = (this->m_SubtreeHeaders).m_data;
      puVar7 = (undefined2 *)(*(long *)(lVar6 + 8) + 0x12);
      for (lVar9 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) << 5 != lVar9; lVar9 = lVar9 + 0x20) {
        puVar7[-2] = *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar9);
        puVar7[-1] = *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar9 + 2);
        *puVar7 = *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar9 + 4);
        puVar7[-5] = *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar9);
        puVar7[-4] = *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar9 + 2);
        puVar7[-3] = *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar9 + 4);
        *(undefined8 *)(puVar7 + -9) = *(undefined8 *)((long)pcVar5->m_quantizedAabbMax + lVar9 + 6)
        ;
        puVar7 = puVar7 + 10;
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar6,"cbtBvhSubtreeInfoData",0x59415241)
      ;
    }
  }
  return "cbtQuantizedBvhFloatData";
}

Assistant:

const char* cbtQuantizedBvh::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtQuantizedBvhData* quantizedData = (cbtQuantizedBvhData*)dataBuffer;

	m_bvhAabbMax.serialize(quantizedData->m_bvhAabbMax);
	m_bvhAabbMin.serialize(quantizedData->m_bvhAabbMin);
	m_bvhQuantization.serialize(quantizedData->m_bvhQuantization);

	quantizedData->m_curNodeIndex = m_curNodeIndex;
	quantizedData->m_useQuantization = m_useQuantization;

	quantizedData->m_numContiguousLeafNodes = m_contiguousNodes.size();
	quantizedData->m_contiguousNodesPtr = (cbtOptimizedBvhNodeData*)(m_contiguousNodes.size() ? serializer->getUniquePointer((void*)&m_contiguousNodes[0]) : 0);
	if (quantizedData->m_contiguousNodesPtr)
	{
		int sz = sizeof(cbtOptimizedBvhNodeData);
		int numElem = m_contiguousNodes.size();
		cbtChunk* chunk = serializer->allocate(sz, numElem);
		cbtOptimizedBvhNodeData* memPtr = (cbtOptimizedBvhNodeData*)chunk->m_oldPtr;
		for (int i = 0; i < numElem; i++, memPtr++)
		{
			m_contiguousNodes[i].m_aabbMaxOrg.serialize(memPtr->m_aabbMaxOrg);
			m_contiguousNodes[i].m_aabbMinOrg.serialize(memPtr->m_aabbMinOrg);
			memPtr->m_escapeIndex = m_contiguousNodes[i].m_escapeIndex;
			memPtr->m_subPart = m_contiguousNodes[i].m_subPart;
			memPtr->m_triangleIndex = m_contiguousNodes[i].m_triangleIndex;
			// Fill padding with zeros to appease msan.
			memset(memPtr->m_pad, 0, sizeof(memPtr->m_pad));
		}
		serializer->finalizeChunk(chunk, "cbtOptimizedBvhNodeData", BT_ARRAY_CODE, (void*)&m_contiguousNodes[0]);
	}

	quantizedData->m_numQuantizedContiguousNodes = m_quantizedContiguousNodes.size();
	//	printf("quantizedData->m_numQuantizedContiguousNodes=%d\n",quantizedData->m_numQuantizedContiguousNodes);
	quantizedData->m_quantizedContiguousNodesPtr = (cbtQuantizedBvhNodeData*)(m_quantizedContiguousNodes.size() ? serializer->getUniquePointer((void*)&m_quantizedContiguousNodes[0]) : 0);
	if (quantizedData->m_quantizedContiguousNodesPtr)
	{
		int sz = sizeof(cbtQuantizedBvhNodeData);
		int numElem = m_quantizedContiguousNodes.size();
		cbtChunk* chunk = serializer->allocate(sz, numElem);
		cbtQuantizedBvhNodeData* memPtr = (cbtQuantizedBvhNodeData*)chunk->m_oldPtr;
		for (int i = 0; i < numElem; i++, memPtr++)
		{
			memPtr->m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex;
			memPtr->m_quantizedAabbMax[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[2];
		}
		serializer->finalizeChunk(chunk, "cbtQuantizedBvhNodeData", BT_ARRAY_CODE, (void*)&m_quantizedContiguousNodes[0]);
	}

	quantizedData->m_traversalMode = int(m_traversalMode);
	quantizedData->m_numSubtreeHeaders = m_SubtreeHeaders.size();

	quantizedData->m_subTreeInfoPtr = (cbtBvhSubtreeInfoData*)(m_SubtreeHeaders.size() ? serializer->getUniquePointer((void*)&m_SubtreeHeaders[0]) : 0);
	if (quantizedData->m_subTreeInfoPtr)
	{
		int sz = sizeof(cbtBvhSubtreeInfoData);
		int numElem = m_SubtreeHeaders.size();
		cbtChunk* chunk = serializer->allocate(sz, numElem);
		cbtBvhSubtreeInfoData* memPtr = (cbtBvhSubtreeInfoData*)chunk->m_oldPtr;
		for (int i = 0; i < numElem; i++, memPtr++)
		{
			memPtr->m_quantizedAabbMax[0] = m_SubtreeHeaders[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_SubtreeHeaders[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_SubtreeHeaders[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_SubtreeHeaders[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_SubtreeHeaders[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_SubtreeHeaders[i].m_quantizedAabbMin[2];

			memPtr->m_rootNodeIndex = m_SubtreeHeaders[i].m_rootNodeIndex;
			memPtr->m_subtreeSize = m_SubtreeHeaders[i].m_subtreeSize;
		}
		serializer->finalizeChunk(chunk, "cbtBvhSubtreeInfoData", BT_ARRAY_CODE, (void*)&m_SubtreeHeaders[0]);
	}
	return cbtQuantizedBvhDataName;
}